

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# changesoplex.hpp
# Opt level: O1

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::doRemoveCol(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,int i)

{
  SPxStatus SVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int32_t iVar9;
  cpp_dec_float<100U,_int,_void> *pcVar10;
  
  pcVar10 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
  uVar2 = *(undefined8 *)((pcVar10->data)._M_elems + 2);
  uVar3 = *(undefined8 *)((pcVar10->data)._M_elems + 4);
  uVar4 = *(undefined8 *)((pcVar10->data)._M_elems + 6);
  uVar5 = *(undefined8 *)((pcVar10->data)._M_elems + 8);
  uVar6 = *(undefined8 *)((pcVar10->data)._M_elems + 10);
  uVar7 = *(undefined8 *)((pcVar10->data)._M_elems + 0xc);
  uVar8 = *(undefined8 *)((pcVar10->data)._M_elems + 0xe);
  *(undefined8 *)(this->m_nonbasicValue).m_backend.data._M_elems =
       *(undefined8 *)(pcVar10->data)._M_elems;
  *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 2) = uVar2;
  *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 4) = uVar3;
  *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 6) = uVar4;
  *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 8) = uVar5;
  *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 10) = uVar6;
  *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 0xc) = uVar7;
  *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 0xe) = uVar8;
  (this->m_nonbasicValue).m_backend.exp = pcVar10->exp;
  (this->m_nonbasicValue).m_backend.neg = pcVar10->neg;
  iVar9 = pcVar10->prec_elem;
  (this->m_nonbasicValue).m_backend.fpclass = pcVar10->fpclass;
  (this->m_nonbasicValue).m_backend.prec_elem = iVar9;
  this->m_nonbasicValueUpToDate = false;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::doRemoveCol(&this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ,i);
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x77])(this);
  if ((this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thestatus < SINGULAR) {
    return;
  }
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::removedCol(&this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,i);
  SVar1 = (this->
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thestatus;
  if (SVar1 != UNBOUNDED) {
    if (SVar1 == OPTIMAL) {
      if (this->m_status == OPTIMAL) {
        this->m_status = UNKNOWN;
      }
      if ((this->
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thestatus == DUAL) {
        return;
      }
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thestatus = DUAL;
      return;
    }
    if (SVar1 != PRIMAL) {
      return;
    }
  }
  if (this->m_status == OPTIMAL) {
    this->m_status = UNKNOWN;
  }
  if ((this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thestatus != REGULAR) {
    (this->
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).thestatus = REGULAR;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::doRemoveCol(int i)
{
   forceRecompNonbasicValue();

   SPxLPBase<R>::doRemoveCol(i);

   unInit();

   if(SPxBasisBase<R>::status() > SPxBasisBase<R>::NO_PROBLEM)
   {
      this->removedCol(i);

      switch(SPxBasisBase<R>::status())
      {
      case SPxBasisBase<R>::PRIMAL:
      case SPxBasisBase<R>::UNBOUNDED:
         setBasisStatus(SPxBasisBase<R>::REGULAR);
         break;

      case SPxBasisBase<R>::OPTIMAL:
         setBasisStatus(SPxBasisBase<R>::DUAL);
         break;

      default:
         break;
      }
   }
}